

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,double timeout)

{
  bool bVar1;
  int iVar2;
  cmsysProcess *cp;
  char *pcVar3;
  ostream *poVar4;
  long lVar5;
  size_t length_00;
  pointer pbVar6;
  bool bVar7;
  int length;
  string *local_98;
  char *data;
  vector<char,_std::allocator<char>_> tempStdOut;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = captureStdOut;
  for (pbVar6 = (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar6 != (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pbVar6->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&tempStdOut);
  }
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&tempStdOut);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,dir);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (outputflag == OUTPUT_MERGE) {
LAB_00315669:
    cmsysProcess_SetOption(cp,2,1);
LAB_0031567f:
    bVar1 = false;
    captureStdErr = (string *)0x0;
  }
  else {
    if (outputflag == OUTPUT_PASSTHROUGH) {
      cmsysProcess_SetPipeShared(cp,2,1);
      cmsysProcess_SetPipeShared(cp,3,1);
      local_98 = (string *)0x0;
      goto LAB_0031567f;
    }
    if (captureStdErr == (string *)0x0) goto LAB_0031567f;
    bVar1 = true;
    if (captureStdErr == local_98) goto LAB_00315669;
  }
  cmsysProcess_SetTimeout(cp,timeout);
  cmsysProcess_Execute(cp);
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((outputflag != OUTPUT_PASSTHROUGH) &&
     (!(bool)(outputflag == OUTPUT_NONE & ~bVar1 & local_98 == (string *)0x0))) {
    while (iVar2 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), 0 < iVar2) {
      for (lVar5 = 0; length_00 = (size_t)length, lVar5 < (long)length_00; lVar5 = lVar5 + 1) {
        if (data[lVar5] == '\0') {
          data[lVar5] = ' ';
        }
      }
      if (iVar2 == 2) {
        if (outputflag != OUTPUT_NONE) {
          Stdout(data,length_00);
        }
        if (local_98 != (string *)0x0) {
          std::vector<char,std::allocator<char>>::insert<char*,void>
                    ((vector<char,std::allocator<char>> *)&tempStdOut,
                     (const_iterator)
                     tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,data,data + length);
        }
      }
      else if (iVar2 == 3) {
        if (outputflag != OUTPUT_NONE) {
          Stderr(data,length_00);
        }
        if (bVar1) {
          std::vector<char,std::allocator<char>>::insert<char*,void>
                    ((vector<char,std::allocator<char>> *)&tempStdErr,
                     (const_iterator)
                     tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,data,data + length);
        }
      }
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if (local_98 != (string *)0x0) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)local_98,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  if (bVar1) {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
              ((string *)captureStdErr,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  iVar2 = cmsysProcess_GetState(cp);
  if (iVar2 == 4) {
    if (retVal == (int *)0x0) {
      iVar2 = cmsysProcess_GetExitValue(cp);
      bVar7 = iVar2 == 0;
    }
    else {
      iVar2 = cmsysProcess_GetExitValue(cp);
      *retVal = iVar2;
      bVar7 = true;
    }
  }
  else {
    iVar2 = cmsysProcess_GetState(cp);
    if (iVar2 == 2) {
      pcVar3 = cmsysProcess_GetExceptionString(cp);
      if (outputflag != OUTPUT_NONE) {
        poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      if (bVar1) {
        strlen(pcVar3);
        std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar3);
      }
    }
    else {
      iVar2 = cmsysProcess_GetState(cp);
      if (iVar2 == 1) {
        pcVar3 = cmsysProcess_GetErrorString(cp);
        if (outputflag != OUTPUT_NONE) {
          poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        if (bVar1) {
          strlen(pcVar3);
          std::__cxx11::string::append((char *)captureStdErr,(ulong)pcVar3);
        }
      }
      else {
        iVar2 = cmsysProcess_GetState(cp);
        bVar7 = true;
        if (iVar2 != 5) goto LAB_00315908;
        if (outputflag != OUTPUT_NONE) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Process terminated due to timeout\n");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        if (bVar1) {
          std::__cxx11::string::append((char *)captureStdErr,0x4bc20e);
        }
      }
    }
    bVar7 = false;
  }
LAB_00315908:
  cmsysProcess_Delete(cp);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdErr.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdOut.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return bVar7;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string>const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr,
                                     int* retVal , const char* dir ,
                                     OutputOption outputflag ,
                                     double timeout )
{
  std::vector<const char*> argv;
  for(std::vector<std::string>::const_iterator a = command.begin();
      a != command.end(); ++a)
    {
    argv.push_back(a->c_str());
    }
  argv.push_back(0);

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if(cmSystemTools::GetRunCommandHideConsole())
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
    }

  if (outputflag == OUTPUT_PASSTHROUGH)
    {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    captureStdOut = 0;
    captureStdErr = 0;
    }
  else if (outputflag == OUTPUT_MERGE ||
           (captureStdErr && captureStdErr == captureStdOut))
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    captureStdErr = 0;
    }
  assert(!captureStdErr || captureStdErr != captureStdOut);

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  if(outputflag != OUTPUT_PASSTHROUGH &&
     (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE))
    {
    while((pipe = cmsysProcess_WaitForData(cp, &data, &length, 0)) > 0)
      {
      // Translate NULL characters in the output into valid text.
      // Visual Studio 7 puts these characters in the output of its
      // build process.
      for(int i=0; i < length; ++i)
        {
        if(data[i] == '\0')
          {
          data[i] = ' ';
          }
        }

      if (pipe == cmsysProcess_Pipe_STDOUT)
        {
        if (outputflag != OUTPUT_NONE)
          {
          cmSystemTools::Stdout(data, length);
          }
        if (captureStdOut)
          {
          tempStdOut.insert(tempStdOut.end(), data, data+length);
          }
        }
      else if (pipe == cmsysProcess_Pipe_STDERR)
        {
        if (outputflag != OUTPUT_NONE)
          {
          cmSystemTools::Stderr(data, length);
          }
        if (captureStdErr)
          {
          tempStdErr.insert(tempStdErr.end(), data, data+length);
          }
        }
      }
    }

  cmsysProcess_WaitForExit(cp, 0);
  if (captureStdOut)
    {
    captureStdOut->assign(tempStdOut.begin(), tempStdOut.end());
    }
  if (captureStdErr)
    {
    captureStdErr->assign(tempStdErr.begin(), tempStdErr.end());
    }

  bool result = true;
  if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exited)
    {
    if ( retVal )
      {
      *retVal = cmsysProcess_GetExitValue(cp);
      }
    else
      {
      if ( cmsysProcess_GetExitValue(cp) !=  0 )
        {
        result = false;
        }
      }
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exception)
    {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << exception_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(exception_str, strlen(exception_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Error)
    {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Expired)
    {
    const char* error_str = "Process terminated due to timeout\n";
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }

  cmsysProcess_Delete(cp);
  return result;
}